

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::IfConversion::CheckBlock
          (IfConversion *this,BasicBlock *block,DominatorAnalysis *dominators,BasicBlock **common)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  uint32_t uVar4;
  CFG *pCVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar6;
  IRContext *pIVar7;
  const_reference pvVar8;
  BasicBlock *pBVar9;
  BasicBlock *b;
  Instruction *pIVar10;
  Instruction *merge;
  Instruction *branch;
  BasicBlock *inc1;
  BasicBlock *inc0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *preds;
  BasicBlock **common_local;
  DominatorAnalysis *dominators_local;
  BasicBlock *block_local;
  IfConversion *this_local;
  
  pCVar5 = Pass::cfg(&this->super_Pass);
  uVar2 = BasicBlock::id(block);
  this_00 = CFG::preds(pCVar5,uVar2);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
  if (sVar6 == 2) {
    pIVar7 = Pass::context(&this->super_Pass);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
    pBVar9 = IRContext::get_instr_block(pIVar7,*pvVar8);
    bVar1 = DominatorAnalysisBase::Dominates(&dominators->super_DominatorAnalysisBase,block,pBVar9);
    if (!bVar1) {
      pIVar7 = Pass::context(&this->super_Pass);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,1);
      b = IRContext::get_instr_block(pIVar7,*pvVar8);
      bVar1 = DominatorAnalysisBase::Dominates(&dominators->super_DominatorAnalysisBase,block,b);
      if ((!bVar1) && (pBVar9 != b)) {
        pBVar9 = DominatorAnalysisBase::CommonDominator
                           (&dominators->super_DominatorAnalysisBase,pBVar9,b);
        *common = pBVar9;
        if (*common != (BasicBlock *)0x0) {
          pCVar5 = Pass::cfg(&this->super_Pass);
          bVar1 = CFG::IsPseudoEntryBlock(pCVar5,*common);
          if (!bVar1) {
            pIVar10 = BasicBlock::terminator(*common);
            OVar3 = Instruction::opcode(pIVar10);
            if (OVar3 != OpBranchConditional) {
              return false;
            }
            pIVar10 = BasicBlock::GetMergeInst(*common);
            if ((pIVar10 == (Instruction *)0x0) ||
               (OVar3 = Instruction::opcode(pIVar10), OVar3 != OpSelectionMerge)) {
              return false;
            }
            uVar2 = Instruction::GetSingleWordInOperand(pIVar10,1);
            if (uVar2 == 2) {
              return false;
            }
            uVar2 = BasicBlock::MergeBlockIdIfAny(*common);
            uVar4 = BasicBlock::id(block);
            if (uVar2 == uVar4) {
              return true;
            }
            return false;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool IfConversion::CheckBlock(BasicBlock* block, DominatorAnalysis* dominators,
                              BasicBlock** common) {
  const std::vector<uint32_t>& preds = cfg()->preds(block->id());

  // TODO(alan-baker): Extend to more than two predecessors
  if (preds.size() != 2) return false;

  BasicBlock* inc0 = context()->get_instr_block(preds[0]);
  if (dominators->Dominates(block, inc0)) return false;

  BasicBlock* inc1 = context()->get_instr_block(preds[1]);
  if (dominators->Dominates(block, inc1)) return false;

  if (inc0 == inc1) {
    // If the predecessor blocks are the same, then there is only 1 value for
    // the OpPhi.  Other transformation should be able to simplify that.
    return false;
  }
  // All phis will have the same common dominator, so cache the result
  // for this block. If there is no common dominator, then we cannot transform
  // any phi in this basic block.
  *common = dominators->CommonDominator(inc0, inc1);
  if (!*common || cfg()->IsPseudoEntryBlock(*common)) return false;
  Instruction* branch = (*common)->terminator();
  if (branch->opcode() != spv::Op::OpBranchConditional) return false;
  auto merge = (*common)->GetMergeInst();
  if (!merge || merge->opcode() != spv::Op::OpSelectionMerge) return false;
  if (spv::SelectionControlMask(merge->GetSingleWordInOperand(1)) ==
      spv::SelectionControlMask::DontFlatten) {
    return false;
  }
  if ((*common)->MergeBlockIdIfAny() != block->id()) return false;

  return true;
}